

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O3

void __thiscall DRAG<TTA>::FirstScan(DRAG<TTA> *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar4->field_0x8;
  uVar14 = (ulong)iVar2;
  iVar3 = *(int *)&pMVar4->field_0xc;
  lVar21 = (long)iVar3;
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  if (0 < (long)uVar14) {
    uVar12 = 0;
    do {
      if (0 < iVar3) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar10 = **(long **)&pMVar4->field_0x48;
        lVar11 = lVar10 * uVar12 + *(long *)&pMVar4->field_0x10;
        lVar19 = lVar11 - lVar10;
        lVar16 = lVar19 - lVar10;
        lVar10 = lVar10 + lVar11;
        lVar6 = **(long **)&pMVar5->field_0x48;
        lVar18 = lVar6 * uVar12 + *(long *)&pMVar5->field_0x10;
        lVar9 = lVar18 + lVar6 * -2;
        lVar6 = lVar9 + -8;
        lVar1 = lVar16 + -1;
        uVar17 = uVar12 | 1;
        uVar20 = 0;
        do {
          lVar15 = lVar9;
          if (*(char *)(lVar11 + uVar20) == '\0') {
            if ((uVar17 < uVar14) && (*(char *)(lVar10 + uVar20) != '\0')) {
              uVar8 = uVar20 | 1;
              if (((long)uVar8 < lVar21) && (*(char *)(lVar11 + uVar8) != '\0')) {
                if (uVar20 != 0) {
                  if (*(char *)((uVar20 - 1) + lVar11) != '\0') {
                    if (uVar12 != 0) {
                      if (*(char *)(lVar19 + uVar8) == '\0') goto LAB_00121a02;
                      goto LAB_001218f5;
                    }
                    goto LAB_00121f15;
                  }
                  if (*(char *)(lVar10 + -1 + uVar20) == '\0') goto LAB_001219a6;
                  if (uVar12 == 0) goto LAB_00121f15;
                  if (*(char *)(lVar19 + uVar8) == '\0') {
                    if ((lVar21 <= (long)(uVar20 + 2)) || (*(char *)(lVar19 + uVar20 + 2) == '\0'))
                    {
                      if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_00121f15;
                      if (*(char *)((uVar20 - 2) + lVar11) == '\0') goto LAB_00121dac;
                      goto LAB_00121911;
                    }
                    if (*(char *)(lVar16 + uVar8) == '\0') {
                      if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_00121a35;
                      if (*(char *)(lVar11 + -2 + uVar20) == '\0') {
                        uVar7 = TTA::Merge(*(uint *)(lVar9 + uVar20 * 4),
                                           *(uint *)(lVar9 + 8 + uVar20 * 4));
                        uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                      }
                      else {
                        if (*(char *)(lVar19 + -1 + uVar20) == '\0') goto LAB_00121f56;
                        uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
                        uVar13 = *(uint *)(lVar9 + 8 + uVar20 * 4);
                      }
                      uVar7 = TTA::Merge(uVar7,uVar13);
                      *(uint *)(lVar18 + uVar20 * 4) = uVar7;
                      goto LAB_00121f1e;
                    }
                  }
                  if (*(char *)((uVar20 - 2) + lVar11) == '\0') goto LAB_00121dac;
LAB_00121a82:
                  if (uVar20 != 0 && uVar12 != 0) {
                    if (*(char *)(lVar19 + -1 + uVar20) != '\0') {
LAB_00121c4c:
                      if (uVar12 != 0) {
                        lVar15 = lVar6;
                        if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_00121b6c;
                        goto LAB_00121af5;
                      }
                      goto LAB_00121ca1;
                    }
LAB_00121aa6:
                    if (*(char *)(lVar19 + -2 + uVar20) != '\0') {
                      if (*(char *)(lVar1 + uVar20) != '\0') goto LAB_00121c4c;
                      goto LAB_00121ca1;
                    }
                  }
LAB_00121d5f:
                  uVar7 = *(uint *)(lVar9 + uVar20 * 4);
                  uVar13 = *(uint *)(lVar18 + (uVar20 - 2) * 4);
LAB_00121d70:
                  uVar7 = TTA::Merge(uVar7,uVar13);
                  *(uint *)(lVar18 + uVar20 * 4) = uVar7;
                  goto LAB_00121f1e;
                }
                uVar8 = 1;
LAB_001219a6:
                if (((uVar12 != 0) && ((long)uVar8 < lVar21)) && (*(char *)(lVar19 + uVar8) != '\0')
                   ) goto LAB_00121b6c;
                if ((uVar12 == 0) || (lVar21 <= (long)(uVar20 + 2))) {
                  if (uVar12 == 0) goto LAB_00121bd8;
                }
                else if (*(char *)(lVar19 + uVar20 + 2) != '\0') {
                  if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_00121d11;
                  goto LAB_00121b37;
                }
                if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_00121b6c;
              }
              else if ((uVar20 != 0) &&
                      ((*(char *)((uVar20 - 1) + lVar10) != '\0' ||
                       (*(char *)(lVar11 + -1 + uVar20) != '\0')))) goto LAB_00121f15;
LAB_00121bd8:
              uVar8 = (ulong)TTA::length_;
              TTA::rtable_[uVar8] = TTA::length_;
              TTA::next_[uVar8] = 0xffffffff;
              TTA::tail_[TTA::length_] = TTA::length_;
              uVar7 = TTA::length_ + 1;
              *(uint *)(lVar18 + uVar20 * 4) = TTA::length_;
              TTA::length_ = uVar7;
            }
            else {
              uVar8 = uVar20 | 1;
              if ((long)uVar8 < lVar21) {
                if (*(char *)(lVar11 + uVar8) != '\0') goto LAB_001219a6;
                if ((uVar17 < uVar14) && (*(char *)(lVar10 + uVar8) != '\0')) goto LAB_00121bd8;
              }
              *(undefined4 *)(lVar18 + uVar20 * 4) = 0;
            }
          }
          else {
            if (uVar20 == 0) {
LAB_00121ac7:
              uVar8 = uVar20 | 1;
              if ((uVar12 == 0) || ((lVar21 <= (long)uVar8 || (*(char *)(lVar19 + uVar8) == '\0'))))
              {
                if (((long)uVar8 < lVar21) &&
                   (((*(char *)(lVar11 + uVar8) != '\0' && (uVar12 != 0)) &&
                    ((long)(uVar20 + 2) < lVar21)))) {
                  if (*(char *)(lVar19 + uVar20 + 2) != '\0') {
                    if (*(char *)(lVar19 + uVar20) == '\0') {
                      if ((uVar20 == 0) || (*(char *)(lVar19 + -1 + uVar20) == '\0')) {
LAB_00121d11:
                        uVar7 = *(uint *)(lVar9 + 8 + uVar20 * 4);
                        goto LAB_00121f1a;
                      }
                      if (*(char *)(lVar16 + uVar8) == '\0') goto LAB_00121d02;
                      goto LAB_00121af5;
                    }
LAB_00121b37:
                    if ((lVar21 <= (long)uVar8) || (*(char *)(lVar16 + uVar8) == '\0')) {
                      uVar7 = *(uint *)(lVar9 + uVar20 * 4);
                      goto LAB_00121b50;
                    }
                    goto LAB_00121b6c;
                  }
                }
                else if (uVar12 == 0) goto LAB_00121bd8;
                if ((*(char *)(lVar19 + uVar20) == '\0') &&
                   ((uVar12 == 0 || uVar20 == 0 ||
                    (lVar15 = lVar6, *(char *)(lVar19 + -1 + uVar20) == '\0')))) goto LAB_00121bd8;
              }
              else if (((*(char *)(lVar19 + uVar20) == '\0') && (uVar20 != 0)) &&
                      (*(char *)(lVar19 + -1 + uVar20) != '\0')) {
LAB_00121af5:
                lVar15 = lVar6;
                if (*(char *)(lVar16 + uVar20) == '\0') {
LAB_00121ca1:
                  uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
                  uVar13 = *(uint *)(lVar9 + uVar20 * 4);
                  goto LAB_00121dba;
                }
              }
LAB_00121b6c:
              uVar7 = *(uint *)(lVar15 + uVar20 * 4);
            }
            else {
              if (*(char *)(lVar11 + -1 + uVar20) == '\0') {
                if ((uVar14 <= uVar17) || (*(char *)(lVar10 + -1 + uVar20) == '\0'))
                goto LAB_00121ac7;
                uVar8 = uVar20 | 1;
                if (((uVar12 != 0) && ((long)uVar8 < lVar21)) && (*(char *)(lVar19 + uVar8) != '\0')
                   ) {
                  if (*(char *)((uVar20 - 2) + lVar11) != '\0') goto LAB_00121a82;
                  if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_00121dac;
                  if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                    uVar7 = *(uint *)(lVar9 + uVar20 * 4);
                    goto LAB_00121db5;
                  }
LAB_00121e00:
                  if ((uVar12 == 0) || (*(char *)(lVar16 + uVar20) == '\0')) {
                    uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
                    uVar13 = *(uint *)(lVar9 + uVar20 * 4);
                    goto LAB_00121fc2;
                  }
                  uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
LAB_00121ee4:
                  uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_00121d70;
                }
                if (((lVar21 <= (long)uVar8) || (*(char *)(lVar11 + uVar8) == '\0')) ||
                   ((uVar12 == 0 ||
                    ((lVar21 <= (long)(uVar20 + 2) || (*(char *)(lVar19 + uVar20 + 2) == '\0'))))))
                {
                  if (uVar12 == 0) goto LAB_00121f15;
                  if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                    if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_00121f15;
                    if (*(char *)((uVar20 - 2) + lVar11) == '\0') goto LAB_00121dac;
                    goto LAB_00121d34;
                  }
                  uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
                  if (*(char *)(lVar11 + -2 + uVar20) != '\0') goto LAB_00121d56;
                  uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
LAB_00121e27:
                  uVar7 = TTA::Merge(uVar7,uVar13);
                  *(uint *)(lVar18 + uVar20 * 4) = uVar7;
                  goto LAB_00121f1e;
                }
                if (*(char *)(lVar11 + -2 + uVar20) == '\0') {
                  if (*(char *)(lVar19 + uVar20) != '\0') {
                    uVar7 = *(uint *)(lVar9 + uVar20 * 4);
                    if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_00121ee4;
                    uVar13 = *(uint *)(lVar9 + 8 + uVar20 * 4);
LAB_00121fc2:
                    uVar7 = TTA::Merge(uVar7,uVar13);
                    uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                    goto LAB_00121d70;
                  }
                  if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                    uVar7 = *(uint *)(lVar9 + 8 + uVar20 * 4);
                    goto LAB_00121db5;
                  }
                  if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_00121e00;
                  uVar7 = TTA::Merge(*(uint *)(lVar9 + -8 + uVar20 * 4),
                                     *(uint *)(lVar9 + 8 + uVar20 * 4));
                  uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_00121dba;
                }
                if (*(char *)(lVar19 + -1 + uVar20) == '\0') {
                  if (*(char *)(lVar16 + uVar8) == '\0') {
                    if (*(char *)(lVar19 + uVar20) == '\0') goto LAB_00121a35;
LAB_00121f56:
                    lVar15 = uVar20 - 2;
                    if ((uVar20 != 0 && uVar12 != 0) && (*(char *)(lVar19 + lVar15) != '\0')) {
                      if (*(char *)(lVar1 + uVar20) == '\0') {
                        uVar7 = TTA::Merge(*(uint *)(lVar9 + uVar20 * 4),
                                           *(uint *)(lVar9 + 8 + uVar20 * 4));
                        uVar13 = *(uint *)(lVar18 + lVar15 * 4);
                      }
                      else {
                        uVar7 = *(uint *)(lVar9 + lVar15 * 4);
                        uVar13 = *(uint *)(lVar9 + 8 + uVar20 * 4);
                      }
                      goto LAB_00121d70;
                    }
                    uVar7 = TTA::Merge(*(uint *)(lVar9 + uVar20 * 4),
                                       *(uint *)(lVar9 + 8 + uVar20 * 4));
                    uVar13 = *(uint *)(lVar18 + lVar15 * 4);
                    goto LAB_00121dba;
                  }
                  goto LAB_00121aa6;
                }
                if (*(char *)(lVar16 + uVar8) != '\0') goto LAB_00121c4c;
LAB_00121d02:
                uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
LAB_00121b50:
                uVar13 = *(uint *)(lVar9 + 8 + uVar20 * 4);
              }
              else {
                uVar8 = uVar20 | 1;
                if (((uVar12 == 0) || (lVar21 <= (long)uVar8)) ||
                   (*(char *)(lVar19 + uVar8) == '\0')) {
                  if (((long)uVar8 < lVar21) && (*(char *)(lVar11 + uVar8) != '\0')) {
LAB_00121a02:
                    if ((uVar12 != 0) &&
                       (((long)(uVar20 + 2) < lVar21 && (*(char *)(lVar19 + uVar20 + 2) != '\0'))))
                    {
                      if (*(char *)(lVar16 + 1 + uVar20) == '\0') {
LAB_00121a35:
                        uVar7 = *(uint *)(lVar9 + 8 + uVar20 * 4);
                        goto LAB_00121db5;
                      }
                      goto LAB_001218f5;
                    }
                  }
LAB_00121f15:
                  uVar7 = *(uint *)(lVar18 + -8 + uVar20 * 4);
                  goto LAB_00121f1a;
                }
LAB_001218f5:
                if (*(char *)(lVar19 + uVar20) != '\0') goto LAB_00121b6c;
                if (*(char *)(lVar16 + uVar20) != '\0') {
LAB_00121911:
                  if (uVar20 != 0 && uVar12 != 0) {
                    lVar15 = lVar6;
                    if (*(char *)(lVar19 + -1 + uVar20) != '\0') goto LAB_00121b6c;
LAB_00121d34:
                    if (*(char *)(lVar19 + -2 + uVar20) != '\0') {
                      uVar7 = *(uint *)(lVar9 + -8 + uVar20 * 4);
                      if (*(char *)(lVar1 + uVar20) == '\0') {
                        uVar13 = *(uint *)(lVar9 + uVar20 * 4);
                        goto LAB_00121e27;
                      }
LAB_00121d56:
                      *(uint *)(lVar18 + uVar20 * 4) = uVar7;
                      goto LAB_00121f1e;
                    }
                  }
                  goto LAB_00121d5f;
                }
LAB_00121dac:
                uVar7 = *(uint *)(lVar9 + uVar20 * 4);
LAB_00121db5:
                uVar13 = *(uint *)(lVar18 + -8 + uVar20 * 4);
              }
LAB_00121dba:
              uVar7 = TTA::Merge(uVar7,uVar13);
            }
LAB_00121f1a:
            *(uint *)(lVar18 + uVar20 * 4) = uVar7;
          }
LAB_00121f1e:
          uVar20 = uVar20 + 2;
        } while ((long)uVar20 < lVar21);
      }
      uVar12 = uVar12 + 2;
    } while ((int)uVar12 < iVar2);
  }
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }